

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

DObject * __thiscall PClass::CreateNew(PClass *this)

{
  DObject *__s;
  ulong __n;
  
  __s = (DObject *)
        M_Malloc_Dbg((ulong)*(uint *)((long)&(this->super_PNativeStruct).super_PStruct.
                                             super_PNamedType.super_PCompoundType.super_PType.
                                             super_PTypeBase.super_DObject + 0x24),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                     ,0xc40);
  if (__s != (DObject *)0x0) {
    __n = (ulong)*(uint *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                                  super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                          0x24);
    if (this->Defaults == (BYTE *)0x0) {
      memset(__s,0,__n);
    }
    else {
      memcpy(__s,this->Defaults,__n);
    }
    (*this->ConstructNative)(__s);
    __s->Class = this;
    InitializeSpecials(this,__s);
    return __s;
  }
  __assert_fail("mem != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0xc41,"DObject *PClass::CreateNew() const");
}

Assistant:

DObject *PClass::CreateNew() const
{
	BYTE *mem = (BYTE *)M_Malloc (Size);
	assert (mem != NULL);

	// Set this object's defaults before constructing it.
	if (Defaults != NULL)
		memcpy (mem, Defaults, Size);
	else
		memset (mem, 0, Size);

	ConstructNative (mem);
	((DObject *)mem)->SetClass (const_cast<PClass *>(this));
	InitializeSpecials(mem);
	return (DObject *)mem;
}